

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O3

ze_result_t zesGetFanProcAddrTable(ze_api_version_t version,zes_fan_dditable_t *pDdiTable)

{
  undefined8 *puVar1;
  long lVar2;
  zes_pfnFanGetProperties_t p_Var3;
  zes_pfnFanGetConfig_t p_Var4;
  zes_pfnFanSetDefaultMode_t p_Var5;
  zes_pfnFanSetFixedSpeedMode_t p_Var6;
  zes_pfnFanGetState_t p_Var7;
  bool bVar8;
  int iVar9;
  ze_result_t zVar10;
  code *UNRECOVERED_JUMPTABLE;
  iterator __begin1;
  undefined8 *puVar11;
  
  puVar11 = (undefined8 *)**(long **)(loader::context + 0x1610);
  puVar1 = (undefined8 *)(*(long **)(loader::context + 0x1610))[1];
  if (puVar1 == puVar11) {
LAB_001beb40:
    zVar10 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else if (pDdiTable == (zes_fan_dditable_t *)0x0) {
    zVar10 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else {
    zVar10 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if ((int)version <= *(int *)(loader::context + 0x15c0)) {
      bVar8 = false;
      do {
        while ((*(int *)(puVar11 + 1) != 0 ||
               (UNRECOVERED_JUMPTABLE = (code *)dlsym(*puVar11,"zesGetFanProcAddrTable"),
               UNRECOVERED_JUMPTABLE == (code *)0x0))) {
LAB_001bea99:
          puVar11 = puVar11 + 0x1b3;
          if (puVar11 == puVar1) {
            if (!bVar8) goto LAB_001beb40;
            goto LAB_001beac8;
          }
        }
        iVar9 = (*UNRECOVERED_JUMPTABLE)(version,puVar11 + 0x18c);
        if (iVar9 != 0) {
          *(int *)(puVar11 + 1) = iVar9;
          goto LAB_001bea99;
        }
        puVar11 = puVar11 + 0x1b3;
        bVar8 = true;
      } while (puVar11 != puVar1);
LAB_001beac8:
      lVar2 = **(long **)(loader::context + 0x1610);
      if (((ulong)(((*(long **)(loader::context + 0x1610))[1] - lVar2 >> 3) * 0x7aff6957aff6957b) <
           2) && (*(char *)(loader::context + 0x1629) != '\x01')) {
        p_Var3 = *(zes_pfnFanGetProperties_t *)(lVar2 + 0xc60);
        p_Var4 = *(zes_pfnFanGetConfig_t *)(lVar2 + 0xc68);
        p_Var5 = *(zes_pfnFanSetDefaultMode_t *)(lVar2 + 0xc70);
        p_Var6 = *(zes_pfnFanSetFixedSpeedMode_t *)(lVar2 + 0xc78);
        p_Var7 = *(zes_pfnFanGetState_t *)(lVar2 + 0xc88);
        pDdiTable->pfnSetSpeedTableMode = *(zes_pfnFanSetSpeedTableMode_t *)(lVar2 + 0xc80);
        pDdiTable->pfnGetState = p_Var7;
        pDdiTable->pfnSetDefaultMode = p_Var5;
        pDdiTable->pfnSetFixedSpeedMode = p_Var6;
        pDdiTable->pfnGetProperties = p_Var3;
        pDdiTable->pfnGetConfig = p_Var4;
      }
      else {
        pDdiTable->pfnGetProperties = loader::zesFanGetProperties;
        pDdiTable->pfnGetConfig = loader::zesFanGetConfig;
        pDdiTable->pfnSetDefaultMode = loader::zesFanSetDefaultMode;
        pDdiTable->pfnSetFixedSpeedMode = loader::zesFanSetFixedSpeedMode;
        pDdiTable->pfnSetSpeedTableMode = loader::zesFanSetSpeedTableMode;
        pDdiTable->pfnGetState = loader::zesFanGetState;
      }
      if (*(long *)(loader::context + 0x1618) == 0) {
        zVar10 = ZE_RESULT_SUCCESS;
      }
      else {
        UNRECOVERED_JUMPTABLE =
             (code *)dlsym(*(long *)(loader::context + 0x1618),"zesGetFanProcAddrTable");
        zVar10 = ZE_RESULT_ERROR_UNINITIALIZED;
        if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
          zVar10 = (*UNRECOVERED_JUMPTABLE)(version,pDdiTable);
          return zVar10;
        }
      }
    }
  }
  return zVar10;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zesGetFanProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    zes_fan_dditable_t* pDdiTable                   ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( loader::context->sysmanInstanceDrivers->size() < 1 ) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( loader::context->version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    bool atLeastOneDriverValid = false;
    // Load the device-driver DDI tables
    for( auto& drv : *loader::context->sysmanInstanceDrivers )
    {
        if(drv.initStatus != ZE_RESULT_SUCCESS)
            continue;
        auto getTable = reinterpret_cast<zes_pfnGetFanProcAddrTable_t>(
            GET_FUNCTION_PTR( drv.handle, "zesGetFanProcAddrTable") );
        if(!getTable) 
            continue; 
        auto getTableResult = getTable( version, &drv.dditable.zes.Fan);
        if(getTableResult == ZE_RESULT_SUCCESS) 
            atLeastOneDriverValid = true;
        else
            drv.initStatus = getTableResult;
    }

    if(!atLeastOneDriverValid)
        result = ZE_RESULT_ERROR_UNINITIALIZED;
    else
        result = ZE_RESULT_SUCCESS;

    if( ZE_RESULT_SUCCESS == result )
    {
        if( ( loader::context->sysmanInstanceDrivers->size() > 1 ) || loader::context->forceIntercept )
        {
            // return pointers to loader's DDIs
            pDdiTable->pfnGetProperties                            = loader::zesFanGetProperties;
            pDdiTable->pfnGetConfig                                = loader::zesFanGetConfig;
            pDdiTable->pfnSetDefaultMode                           = loader::zesFanSetDefaultMode;
            pDdiTable->pfnSetFixedSpeedMode                        = loader::zesFanSetFixedSpeedMode;
            pDdiTable->pfnSetSpeedTableMode                        = loader::zesFanSetSpeedTableMode;
            pDdiTable->pfnGetState                                 = loader::zesFanGetState;
        }
        else
        {
            // return pointers directly to driver's DDIs
            *pDdiTable = loader::context->sysmanInstanceDrivers->front().dditable.zes.Fan;
        }
    }

    // If the validation layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->validationLayer ))
    {
        auto getTable = reinterpret_cast<zes_pfnGetFanProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->validationLayer, "zesGetFanProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        result = getTable( version, pDdiTable );
    }

    return result;
}